

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BpTree2.h
# Opt level: O0

void __thiscall
BpTree<float>::Coalesce(BpTree<float> *this,IndexNode<float> *C,IndexNode<float> *D,float k2)

{
  value_type vVar1;
  value_type vVar2;
  Addr p;
  int iVar3;
  reference pvVar4;
  reference pvVar5;
  reference pvVar6;
  reference pvVar7;
  bool bVar8;
  Addr temp_p;
  IndexNode<float> local_2e8;
  IndexNode<float> local_288;
  Addr local_228;
  IndexNode<float> local_220;
  int local_1c0;
  int local_1bc;
  int pos;
  int m;
  IndexNode<float> P;
  IndexNode<float> E;
  IndexNode<float> local_88;
  value_type local_24;
  IndexNode<float> *pIStack_20;
  float k2_local;
  IndexNode<float> *D_local;
  IndexNode<float> *C_local;
  BpTree<float> *this_local;
  
  local_24 = k2;
  pIStack_20 = D;
  D_local = C;
  C_local = (IndexNode<float> *)this;
  IndexNode<float>::IndexNode(&local_88,C);
  LockNode(this,&local_88);
  IndexNode<float>::~IndexNode(&local_88);
  IndexNode<float>::IndexNode((IndexNode<float> *)&E.self,pIStack_20);
  LockNode(this,(IndexNode<float> *)&E.self);
  IndexNode<float>::~IndexNode((IndexNode<float> *)&E.self);
  IndexNode<float>::IndexNode((IndexNode<float> *)&P.self,this->N);
  IndexNode<float>::IndexNode((IndexNode<float> *)&pos,this->N);
  IndexNode<float>::IndexNode(&local_220,D_local);
  iVar3 = IsLeaf(this,&local_220);
  IndexNode<float>::~IndexNode(&local_220);
  if (iVar3 == 0) {
    local_1c0 = 0;
    while( true ) {
      bVar8 = false;
      if (local_1c0 < this->N + -1) {
        pvVar4 = std::vector<char,_std::allocator<char>_>::operator[]
                           (&pIStack_20->v,(long)local_1c0);
        bVar8 = *pvVar4 == '1';
      }
      vVar1 = local_24;
      if (!bVar8) break;
      local_1c0 = local_1c0 + 1;
    }
    pvVar5 = std::vector<float,_std::allocator<float>_>::operator[](&pIStack_20->k,(long)local_1c0);
    *pvVar5 = vVar1;
    pvVar4 = std::vector<char,_std::allocator<char>_>::operator[](&pIStack_20->v,(long)local_1c0);
    *pvVar4 = '1';
    local_1c0 = local_1c0 + 1;
    local_1bc = 0;
    while (pvVar4 = std::vector<char,_std::allocator<char>_>::operator[]
                              (&D_local->v,(long)local_1bc), *pvVar4 == '1') {
      pvVar5 = std::vector<float,_std::allocator<float>_>::operator[](&D_local->k,(long)local_1bc);
      vVar1 = *pvVar5;
      pvVar5 = std::vector<float,_std::allocator<float>_>::operator[]
                         (&pIStack_20->k,(long)(local_1c0 + local_1bc));
      *pvVar5 = vVar1;
      pvVar6 = std::vector<Addr,_std::allocator<Addr>_>::operator[](&D_local->p,(long)local_1bc);
      pvVar7 = std::vector<Addr,_std::allocator<Addr>_>::operator[]
                         (&pIStack_20->p,(long)(local_1c0 + local_1bc));
      *pvVar7 = *pvVar6;
      pvVar4 = std::vector<char,_std::allocator<char>_>::operator[](&D_local->v,(long)local_1bc);
      vVar2 = *pvVar4;
      pvVar4 = std::vector<char,_std::allocator<char>_>::operator[]
                         (&pIStack_20->v,(long)(local_1c0 + local_1bc));
      *pvVar4 = vVar2;
      local_1bc = local_1bc + 1;
    }
    pvVar6 = std::vector<Addr,_std::allocator<Addr>_>::operator[](&D_local->p,(long)local_1bc);
    pvVar7 = std::vector<Addr,_std::allocator<Addr>_>::operator[]
                       (&pIStack_20->p,(long)(local_1c0 + local_1bc));
    *pvVar7 = *pvVar6;
    local_1bc = 0;
    while( true ) {
      bVar8 = false;
      if (local_1bc < this->N) {
        pvVar6 = std::vector<Addr,_std::allocator<Addr>_>::operator[](&D_local->p,(long)local_1bc);
        bVar8 = pvVar6->FileOff != -1;
      }
      if (!bVar8) break;
      pvVar6 = std::vector<Addr,_std::allocator<Addr>_>::operator[](&D_local->p,(long)local_1bc);
      local_228.BlockNum = pvVar6->BlockNum;
      local_228.FileOff = pvVar6->FileOff;
      FindNode(this,local_228,(IndexNode<float> *)&P.self);
      E.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = *(pointer *)&pIStack_20->self;
      IndexNode<float>::IndexNode(&local_288,(IndexNode<float> *)&P.self);
      UpdateBlock(this,&local_288);
      IndexNode<float>::~IndexNode(&local_288);
      local_1bc = local_1bc + 1;
    }
  }
  else {
    local_1c0 = 0;
    while( true ) {
      bVar8 = false;
      if (local_1c0 < this->N + -1) {
        pvVar4 = std::vector<char,_std::allocator<char>_>::operator[]
                           (&pIStack_20->v,(long)local_1c0);
        bVar8 = *pvVar4 == '1';
      }
      if (!bVar8) break;
      local_1c0 = local_1c0 + 1;
    }
    local_1bc = 0;
    while (pvVar4 = std::vector<char,_std::allocator<char>_>::operator[]
                              (&D_local->v,(long)local_1bc), *pvVar4 == '1') {
      pvVar5 = std::vector<float,_std::allocator<float>_>::operator[](&D_local->k,(long)local_1bc);
      vVar1 = *pvVar5;
      pvVar5 = std::vector<float,_std::allocator<float>_>::operator[]
                         (&pIStack_20->k,(long)(local_1c0 + local_1bc));
      *pvVar5 = vVar1;
      pvVar6 = std::vector<Addr,_std::allocator<Addr>_>::operator[](&D_local->p,(long)local_1bc);
      pvVar7 = std::vector<Addr,_std::allocator<Addr>_>::operator[]
                         (&pIStack_20->p,(long)(local_1c0 + local_1bc));
      *pvVar7 = *pvVar6;
      pvVar4 = std::vector<char,_std::allocator<char>_>::operator[](&D_local->v,(long)local_1bc);
      vVar2 = *pvVar4;
      pvVar4 = std::vector<char,_std::allocator<char>_>::operator[]
                         (&pIStack_20->v,(long)(local_1c0 + local_1bc));
      *pvVar4 = vVar2;
      local_1bc = local_1bc + 1;
    }
    pvVar6 = std::vector<Addr,_std::allocator<Addr>_>::operator[](&D_local->p,(long)(this->N + -1));
    pvVar7 = std::vector<Addr,_std::allocator<Addr>_>::operator[]
                       (&pIStack_20->p,(long)(this->N + -1));
    *pvVar7 = *pvVar6;
  }
  IndexNode<float>::IndexNode(&local_2e8,D_local);
  UpdateBlock(this,&local_2e8);
  IndexNode<float>::~IndexNode(&local_2e8);
  IndexNode<float>::IndexNode((IndexNode<float> *)&temp_p,pIStack_20);
  UpdateBlock(this,(IndexNode<float> *)&temp_p);
  IndexNode<float>::~IndexNode((IndexNode<float> *)&temp_p);
  p = D_local->self;
  FindNode(this,D_local->parent,(IndexNode<float> *)&pos);
  Delete_Aux(this,(IndexNode<float> *)&pos,local_24,D_local->self);
  FindNode(this,p,(IndexNode<float> *)&P.self);
  DeleteNode(this,(IndexNode<float> *)&P.self);
  IndexNode<float>::~IndexNode((IndexNode<float> *)&pos);
  IndexNode<float>::~IndexNode((IndexNode<float> *)&P.self);
  return;
}

Assistant:

void BpTree<K>::Coalesce(IndexNode<K>& C, IndexNode<K>& D, K k2) {
	this->LockNode(C);
	this->LockNode(D);
	IndexNode<K> E(N);
	IndexNode<K> P(N);
	int m, pos;
	if (!this->IsLeaf(C)) {
		//��Ҷ�ڵ�֮��ĺϲ�
		for (pos = 0; pos < N - 1 && D.v[pos] == '1'; pos++);	//D.k[pos]�ǿյģ�D.p[pos+1]�ǿյ�
		D.k[pos] = k2;
		D.v[pos] = '1';
		pos++;
		for (m = 0; C.v[m] == '1'; m++) {
			D.k[pos + m] = C.k[m];
			D.p[pos + m] = C.p[m];
			D.v[pos + m] = C.v[m];
		}
		D.p[pos + m] = C.p[m];
		for (m = 0; m < N && C.p[m].FileOff != -1; m++) {
			this->FindNode(C.p[m], E);
			E.parent = D.self;
			this->UpdateBlock(E);
		}
	}
	else {
		//Ҷ�ڵ�֮��ĺϲ�
		for (pos = 0; pos < N - 1 && D.v[pos] == '1'; pos++);	//D.k[pos]�ǿյģ�D.p[pos]�ǿյ�
		for (m = 0; C.v[m] == '1'; m++) {
			D.k[pos + m] = C.k[m];
			D.p[pos + m] = C.p[m];
			D.v[pos + m] = C.v[m];
		}
		D.p[N - 1] = C.p[N - 1];
	}
	this->UpdateBlock(C);
	this->UpdateBlock(D);
	Addr temp_p = C.self;
	this->FindNode(C.parent, P);
	this->Delete_Aux(P, k2, C.self);
	this->FindNode(temp_p, E);
	this->DeleteNode(E);
	return;
}